

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall ProblemTest_MutAlgebraicCon_Test::TestBody(ProblemTest_MutAlgebraicCon_Test *this)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  pointer pBVar4;
  pointer pAVar5;
  bool bVar6;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar7;
  int con_index;
  size_t index;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int *expected;
  AssertHelper *actual;
  undefined4 uVar11;
  undefined4 uVar12;
  MutAlgebraicCon MVar13;
  AssertionResult gtest_ar;
  double coefs [1];
  NumericConstant expr;
  int num_terms;
  int indices [1];
  Problem p;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  Term local_3c8;
  AssertHelper local_3b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  AssertHelper local_3a8;
  int local_3a0 [2];
  long local_398;
  BasicProblem<mp::BasicProblemParams<int>_> *local_390;
  BasicProblem<mp::BasicProblemParams<int>_> local_388;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_388);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_388,0.0,0.0);
  local_3b0.ptr_._0_4_ = 1;
  local_3b8.data_._0_4_ =
       (int)((ulong)((long)local_388.algebraic_cons_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_388.algebraic_cons_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"1","p.num_algebraic_cons()",(int *)&local_3b0,(int *)&local_3b8
            );
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x191,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  MVar13 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&local_388,0);
  pBVar7 = MVar13.
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  con_index = MVar13.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
  uVar8 = (ulong)con_index;
  pdVar3 = (pBVar7->initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar12 = 0;
  if (uVar8 < (ulong)((long)(pBVar7->initial_dual_values_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar3 >> 3)) {
    dVar2 = pdVar3[uVar8];
    uVar11 = SUB84(dVar2,0);
    uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  local_3b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(uVar12,uVar11);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_3c8,"0","con.dual()",(int *)&local_3b8,(double *)&local_3b0);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x193,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SetInitialDualValue(pBVar7,con_index,4.2);
  local_3b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4010cccccccccccd;
  pdVar3 = (pBVar7->initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar12 = 0;
  if (uVar8 < (ulong)((long)(pBVar7->initial_dual_values_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar3 >> 3)) {
    dVar2 = pdVar3[uVar8];
    uVar11 = SUB84(dVar2,0);
    uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  local_3b8.data_ = (AssertHelperData *)CONCAT44(uVar12,uVar11);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_3c8,"4.2","con.dual()",(double *)&local_3b0,(double *)&local_3b8);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x195,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 (&local_388.super_ExprFactory,42.0);
  if ((ExprBase)local_3b0.ptr_ != (ExprBase)0x0) {
    mp::BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearConExpr
              (pBVar7,con_index,(NumericExpr)local_3b0.ptr_);
  }
  pBVar4 = (pBVar7->nonlinear_cons_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < (ulong)((long)(pBVar7->nonlinear_cons_).
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 3)) {
    local_3b8.data_ = (AssertHelperData *)pBVar4[uVar8].super_ExprBase.impl_;
  }
  else {
    local_3b8.data_ = (AssertHelperData *)0x0;
  }
  actual = &local_3b8;
  testing::internal::
  CmpHelperEQ<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((internal *)&local_3c8,"expr","con.nonlinear_expr()",(NumericConstant *)&local_3b0,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)actual);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3b8);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x198,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if (local_3b8.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b8.data_ + 8))();
      }
      local_3b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3c8.var_index_ = 0xb;
  local_3c8.coef_ = (double)&DAT_400199999999999a;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
  append_element<mp::LinearExpr::Term>
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             ((pBVar7->algebraic_cons_).
              super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar8),&local_3c8);
  local_3a0[1] = 0xb;
  local_3b8.data_ = (AssertHelperData *)&DAT_400199999999999a;
  pAVar5 = (pBVar7->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar1 = &pAVar5[uVar8].lb;
  *pdVar1 = (double)&DAT_400a666666666666;
  pdVar1[1] = (double)&DAT_401199999999999a;
  local_3d0.data_ = (AssertHelperData *)&DAT_400a666666666666;
  local_3d8.data_ = (AssertHelperData *)pAVar5[uVar8].lb;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_3c8,"3.3","con.lb()",(double *)&local_3d0,(double *)&local_3d8);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x19e,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3d0.data_ = (AssertHelperData *)&DAT_401199999999999a;
  local_3d8.data_ =
       (AssertHelperData *)
       (pBVar7->algebraic_cons_).
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar8].ub;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_3c8,"4.4","con.ub()",(double *)&local_3d0,(double *)&local_3d8);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x19f,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3a0[0] = 1;
  local_3d0.data_._0_4_ =
       *(undefined4 *)
        ((long)&(pBVar7->algebraic_cons_).
                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].linear_expr.terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"num_terms","con.linear_expr().num_terms()",local_3a0,
             (int *)&local_3d0);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3d0.data_ =
       *(AssertHelperData **)
        &(pBVar7->algebraic_cons_).
         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar8].linear_expr.terms_.
         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
  local_398 = uVar8 * 0x88;
  local_390 = pBVar7;
  if (0 < local_3a0[0]) {
    expected = local_3a0;
    lVar9 = 0;
    do {
      expected = expected + 1;
      local_3d8.data_._0_4_ = (local_3d0.data_)->type;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_3c8,"indices[i]","it->var_index()",expected,(int *)&local_3d8);
      if ((char)local_3c8.var_index_ == '\0') {
        testing::Message::Message((Message *)&local_3d8);
        pcVar10 = "";
        if ((undefined8 *)local_3c8.coef_ != (undefined8 *)0x0) {
          pcVar10 = *(char **)local_3c8.coef_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0x1a0,pcVar10);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar6 = testing::internal::IsTrue(true);
          if ((bVar6) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
          local_3d8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_3c8.coef_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_3d8.data_ = (AssertHelperData *)(local_3d0.data_)->file;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_3c8,"coefs[i]","it->coef()",(double *)actual,
                 (double *)&local_3d8);
      if ((char)local_3c8.var_index_ == '\0') {
        testing::Message::Message((Message *)&local_3d8);
        pcVar10 = "";
        if ((undefined8 *)local_3c8.coef_ != (undefined8 *)0x0) {
          pcVar10 = *(char **)local_3c8.coef_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0x1a0,pcVar10);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar6 = testing::internal::IsTrue(true);
          if ((bVar6) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
          local_3d8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_3c8.coef_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar9 = lVar9 + 1;
      local_3d0.data_ = (AssertHelperData *)&(local_3d0.data_)->line;
      actual = actual + 1;
    } while (lVar9 < local_3a0[0]);
  }
  pBVar7 = local_390;
  lVar9 = local_398;
  pAVar5 = (local_390->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_3d8.data_ =
       (AssertHelperData *)
       (*(long *)((long)&(pAVar5->linear_expr).terms_.
                         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> +
                 local_398 + 0x10) * 0x10 +
       *(long *)((long)&(pAVar5->linear_expr).terms_.
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> +
                local_398));
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&local_3c8,"con.linear_expr().end()","it",
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)&local_3d8,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d8);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3d8.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d8.data_ + 8))();
      }
      local_3d8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3d0.data_._0_4_ = 1;
  local_3d8.data_._0_4_ =
       *(undefined4 *)
        ((long)&(((pBVar7->algebraic_cons_).
                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start)->linear_expr).terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + lVar9 + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"1","con.linear_expr().num_terms()",(int *)&local_3d0,
             (int *)&local_3d8);
  if ((char)local_3c8.var_index_ == '\0') {
    testing::Message::Message((Message *)&local_3d0);
    if ((undefined8 *)local_3c8.coef_ == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_3c8.coef_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
      local_3d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8.coef_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&local_388,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_388);
  return;
}

Assistant:

TEST(ProblemTest, MutAlgebraicCon) {
  Problem p;
  p.AddCon(0, 0);
  EXPECT_EQ(1, p.num_algebraic_cons());
  Problem::MutAlgebraicCon con = p.algebraic_con(0);
  EXPECT_EQ(0, con.dual());
  con.set_dual(4.2);
  EXPECT_EQ(4.2 , con.dual());
  auto expr = p.MakeNumericConstant(42);
  con.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, con.nonlinear_expr());
  con.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  con.set_lb(3.3);
  con.set_ub(4.4);
  EXPECT_EQ(3.3, con.lb());
  EXPECT_EQ(4.4, con.ub());
  EXPECT_LINEAR_EXPR(con.linear_expr(), indices, coefs);
  EXPECT_EQ(1, con.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::AlgebraicCon ccon = cp.algebraic_con(0);
  ccon = con;
}